

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O3

loader_impl_mock_function mock_function_create(loader_impl_mock_handle mock_handle)

{
  loader_impl_mock_function plVar1;
  
  plVar1 = (loader_impl_mock_function)malloc(0x10);
  if (plVar1 != (loader_impl_mock_function)0x0) {
    plVar1->mock_handle = mock_handle;
    plVar1->function_mock_data = (void *)0x0;
  }
  return plVar1;
}

Assistant:

loader_impl_mock_function mock_function_create(loader_impl_mock_handle mock_handle)
{
	loader_impl_mock_function mock_function = malloc(sizeof(struct loader_impl_mock_function_type));

	if (mock_function != NULL)
	{
		mock_function->mock_handle = mock_handle;

		mock_function->function_mock_data = NULL;

		return mock_function;
	}

	return NULL;
}